

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O2

void __thiscall wabt::ElemSegmentModuleField::~ElemSegmentModuleField(ElemSegmentModuleField *this)

{
  (this->super_ModuleFieldMixin<(wabt::ModuleFieldType)6>).super_ModuleField._vptr_ModuleField =
       (_func_int **)&PTR__ElemSegmentModuleField_0017f958;
  ElemSegment::~ElemSegment(&this->elem_segment);
  return;
}

Assistant:

explicit ElemSegmentModuleField(const Location& loc = Location(),
                                  std::string_view name = std::string_view())
      : ModuleFieldMixin<ModuleFieldType::ElemSegment>(loc),
        elem_segment(name) {}